

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

ByteString * __thiscall SoftHSM::getECDHPubData(SoftHSM *this,ByteString *pubData)

{
  size_t sVar1;
  uchar *puVar2;
  byte *pbVar3;
  unsigned_long uVar4;
  ByteString *in_RDI;
  ByteString *in_stack_00000028;
  ByteString length;
  size_t lengthOctets;
  size_t controlOctets;
  size_t len;
  size_t in_stack_ffffffffffffff78;
  ByteString *in_stack_ffffffffffffff80;
  ByteString *this_00;
  uchar *in_stack_ffffffffffffff98;
  ByteString *in_stack_ffffffffffffffa0;
  undefined8 local_28;
  
  this_00 = in_RDI;
  sVar1 = ByteString::size((ByteString *)0x197e00);
  local_28 = 2;
  if ((((sVar1 == 0x20) || (sVar1 == 0x38)) || (sVar1 == 0x41)) ||
     ((sVar1 == 0x61 || (sVar1 == 0x85)))) {
    local_28 = 0;
  }
  else if ((sVar1 < 2) ||
          (puVar2 = ByteString::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78),
          *puVar2 != '\x04')) {
    local_28 = 0;
  }
  else {
    pbVar3 = ByteString::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (*pbVar3 < 0x80) {
      pbVar3 = ByteString::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if ((ulong)*pbVar3 != sVar1 - 2) {
        local_28 = 0;
      }
    }
    else {
      pbVar3 = ByteString::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      local_28 = (long)(int)(*pbVar3 & 0x7f) + 2;
      if (local_28 < sVar1) {
        ByteString::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        ByteString::ByteString(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(size_t)this_00);
        uVar4 = ByteString::long_val(in_stack_ffffffffffffffa0);
        if (uVar4 != sVar1 - local_28) {
          local_28 = 0;
        }
        ByteString::~ByteString((ByteString *)0x197f79);
      }
      else {
        local_28 = 0;
      }
    }
  }
  if (local_28 == 0) {
    DERUTIL::raw2Octet(in_stack_00000028);
  }
  else {
    ByteString::ByteString(this_00,in_RDI);
  }
  return this_00;
}

Assistant:

ByteString SoftHSM::getECDHPubData(ByteString& pubData)
{
	size_t len = pubData.size();
	size_t controlOctets = 2;
	if (len == 32 || len == 56 || len == 65 || len == 97 || len == 133)
	{
		// Raw: Length matches the public key size of:
		// EDDSA: X25519, X448
		// ECDSA: P-256, P-384, or P-521
		controlOctets = 0;
	}
	else if (len < controlOctets || pubData[0] != 0x04)
	{
		// Raw: Too short or does not start with 0x04
		controlOctets = 0;
	}
	else if (pubData[1] < 0x80)
	{
		// Raw: Length octet does not match remaining data length
		if (pubData[1] != (len - controlOctets)) controlOctets = 0;
	}
	else
	{
		size_t lengthOctets = pubData[1] & 0x7F;
		controlOctets += lengthOctets;

		if (controlOctets >= len)
		{
			// Raw: Too short
			controlOctets = 0;
		}
		else
		{
			ByteString length(&pubData[2], lengthOctets);

			if (length.long_val() != (len - controlOctets))
			{
				// Raw: Length octets does not match remaining data length
				controlOctets = 0;
			}
		}
	}

	// DER format
	if (controlOctets != 0) return pubData;

	return DERUTIL::raw2Octet(pubData);
}